

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O3

positionTy * GetAirportLoc(positionTy *__return_storage_ptr__,string *sICAO)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  float alt;
  float lon;
  float lat;
  char sId [32];
  float local_6c;
  float local_68;
  float local_64;
  positionTy *local_60;
  undefined1 local_58 [40];
  
  local_64 = NAN;
  local_68 = NAN;
  local_6c = NAN;
  iVar4 = XPLMFindFirstNavAidOfType(1);
  uVar6 = (undefined4)DAT_00246870;
  uVar7 = DAT_00246870._4_4_;
  uVar8 = DAT_00246870._8_4_;
  uVar9 = DAT_00246870._12_4_;
  dVar10 = NAN;
  local_60 = __return_storage_ptr__;
  if (iVar4 == -1) {
    dVar2 = (double)DAT_00246870;
    dVar3 = DAT_00246870._8_8_;
  }
  else {
    do {
      XPLMGetNavAidInfo(iVar4,0,&local_64,&local_68,&local_6c,0,0,local_58,0,0);
      iVar5 = std::__cxx11::string::compare((char *)sICAO);
      if (iVar5 == 0) {
        dVar2 = (double)local_64;
        dVar3 = (double)local_68;
        dVar10 = (double)local_6c;
        uVar6 = 0;
        uVar7 = 0x7ff80000;
        uVar8 = 0;
        uVar9 = 0x7ff80000;
        goto LAB_00185d23;
      }
      iVar4 = XPLMGetNextNavAid(iVar4);
    } while (iVar4 != -1);
    uVar6 = (undefined4)DAT_00246870;
    uVar7 = DAT_00246870._4_4_;
    dVar2 = (double)DAT_00246870;
    uVar8 = DAT_00246870._8_4_;
    uVar9 = DAT_00246870._12_4_;
    dVar3 = DAT_00246870._8_8_;
    dVar10 = NAN;
  }
LAB_00185d23:
  auVar1._8_4_ = SUB84(dVar3,0);
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
  local_60->_lat = dVar2;
  local_60->_lon = (double)auVar1._8_8_;
  local_60->_alt = dVar10;
  *(undefined4 *)&local_60->_ts = uVar6;
  *(undefined4 *)((long)&local_60->_ts + 4) = uVar7;
  *(undefined4 *)&local_60->_head = uVar8;
  *(undefined4 *)((long)&local_60->_head + 4) = uVar9;
  *(undefined4 *)&local_60->_pitch = uVar6;
  *(undefined4 *)((long)&local_60->_pitch + 4) = uVar7;
  *(undefined4 *)&local_60->_roll = uVar8;
  *(undefined4 *)((long)&local_60->_roll + 4) = uVar9;
  local_60->mergeCount = 1;
  local_60->f = (posFlagsTy)((ushort)local_60->f & 0x8000);
  local_60->edgeIdx = 0xffffffffffffffff;
  return local_60;
}

Assistant:

positionTy GetAirportLoc (const std::string sICAO)
{
    char sId[32];
    float lat=NAN, lon=NAN, alt=NAN;

    // Loop all airorts
    for (XPLMNavRef navRef = XPLMFindFirstNavAidOfType(xplm_Nav_Airport);
         navRef != XPLM_NAV_NOT_FOUND;
         navRef = XPLMGetNextNavAid(navRef))
    {
        // Get info and check if this is the one
        XPLMGetNavAidInfo(navRef, nullptr,
                          &lat, &lon, &alt,
                          nullptr, nullptr, sId, nullptr, nullptr);
        if (sICAO == sId)
            return positionTy(lat, lon, alt);
    }
    // not found
    return positionTy();
}